

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int compression_init_encoder_gzip(archive *a,la_zstream *lastrm,int level,int withheader)

{
  int iVar1;
  undefined8 *__ptr;
  char *fmt;
  
  if (lastrm->valid != 0) {
    (*lastrm->end)(a,lastrm);
  }
  __ptr = (undefined8 *)calloc(1,0x70);
  if (__ptr == (undefined8 *)0x0) {
    fmt = "Can\'t allocate memory for gzip stream";
    iVar1 = 0xc;
  }
  else {
    *__ptr = lastrm->next_in;
    *(int *)(__ptr + 1) = (int)lastrm->avail_in;
    __ptr[2] = lastrm->total_in;
    __ptr[3] = lastrm->next_out;
    *(int *)(__ptr + 4) = (int)lastrm->avail_out;
    __ptr[5] = lastrm->total_out;
    iVar1 = deflateInit2_(__ptr,level,8,0xf,8,0,"1.2.11",0x70);
    if (iVar1 == 0) {
      lastrm->real_stream = __ptr;
      lastrm->valid = 1;
      lastrm->code = compression_code_gzip;
      lastrm->end = compression_end_gzip;
      return 0;
    }
    free(__ptr);
    lastrm->real_stream = (void *)0x0;
    fmt = "Internal error initializing compression library";
    iVar1 = -1;
  }
  archive_set_error(a,iVar1,fmt);
  return -0x1e;
}

Assistant:

static int
compression_init_encoder_gzip(struct archive *a,
    struct la_zstream *lastrm, int level, int withheader)
{
	z_stream *strm;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm));
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for gzip stream");
		return (ARCHIVE_FATAL);
	}
	/* zlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (Bytef *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = (uInt)lastrm->avail_in;
	strm->total_in = (uLong)lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = (uInt)lastrm->avail_out;
	strm->total_out = (uLong)lastrm->total_out;
	if (deflateInit2(strm, level, Z_DEFLATED,
	    (withheader)?15:-15,
	    8, Z_DEFAULT_STRATEGY) != Z_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lastrm->real_stream = strm;
	lastrm->valid = 1;
	lastrm->code = compression_code_gzip;
	lastrm->end = compression_end_gzip;
	return (ARCHIVE_OK);
}